

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O1

void __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::SetUri(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
         *this)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  Ch *pCVar4;
  
  pCVar4 = this->uri_;
  pcVar1 = this->base_;
  if (pcVar1 == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(pcVar1);
    sVar2 = sVar2 & 0xffffffff;
  }
  memcpy(pCVar4,pcVar1,sVar2);
  if (this->base_ == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    sVar2 = strlen(this->base_);
    uVar3 = sVar2 & 0xffffffff;
  }
  pCVar4 = pCVar4 + uVar3;
  pcVar1 = this->frag_;
  if (pcVar1 == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(pcVar1);
    sVar2 = sVar2 & 0xffffffff;
  }
  memcpy(pCVar4,pcVar1,sVar2);
  if (this->frag_ == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    sVar2 = strlen(this->frag_);
    uVar3 = sVar2 & 0xffffffff;
  }
  pCVar4[uVar3] = '\0';
  return;
}

Assistant:

void SetUri() {
        Ch* next = uri_;
        std::memcpy(next, base_, GetBaseStringLength() * sizeof(Ch));
        next+= GetBaseStringLength();
        std::memcpy(next, frag_, GetFragStringLength() * sizeof(Ch));
        next+= GetFragStringLength();
        *next = '\0';
    }